

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O0

bool __thiscall
testing::internal::ExpectationBase::AllPrerequisitesAreSatisfied(ExpectationBase *this)

{
  bool bVar1;
  pointer pEVar2;
  linked_ptr<testing::internal::ExpectationBase> *plVar3;
  ExpectationBase *pEVar4;
  _Self local_28;
  _Self local_20;
  const_iterator it;
  ExpectationBase *this_local;
  
  it._M_node = (_Base_ptr)this;
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  local_20._M_node = (_Base_ptr)ExpectationSet::begin(&this->immediate_prerequisites_);
  while( true ) {
    local_28._M_node = (_Base_ptr)ExpectationSet::end(&this->immediate_prerequisites_);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) {
      return true;
    }
    pEVar2 = std::_Rb_tree_const_iterator<testing::Expectation>::operator->(&local_20);
    plVar3 = Expectation::expectation_base(pEVar2);
    pEVar4 = linked_ptr<testing::internal::ExpectationBase>::operator->(plVar3);
    bVar1 = IsSatisfied(pEVar4);
    if (!bVar1) break;
    pEVar2 = std::_Rb_tree_const_iterator<testing::Expectation>::operator->(&local_20);
    plVar3 = Expectation::expectation_base(pEVar2);
    pEVar4 = linked_ptr<testing::internal::ExpectationBase>::operator->(plVar3);
    bVar1 = AllPrerequisitesAreSatisfied(pEVar4);
    if (!bVar1) {
      return false;
    }
    std::_Rb_tree_const_iterator<testing::Expectation>::operator++(&local_20);
  }
  return false;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
  g_gmock_mutex.AssertHeld();
  for (ExpectationSet::const_iterator it = immediate_prerequisites_.begin();
       it != immediate_prerequisites_.end(); ++it) {
    if (!(it->expectation_base()->IsSatisfied()) ||
        !(it->expectation_base()->AllPrerequisitesAreSatisfied()))
      return false;
  }
  return true;
}